

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O3

bool chaiscript::dispatch::detail::
     compare_types_cast<chaiscript::Boxed_Value,chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
               (_func_Boxed_Value_Boxed_Value_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
                *param_1,Function_Params *params,Type_Conversions_State *t_conversions)

{
  chaiscript local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  chaiscript local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  boxed_cast<chaiscript::Boxed_Value>(local_30,params->m_begin,t_conversions);
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (local_20,params->m_begin + 1,t_conversions);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }